

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSeparator.cpp
# Opt level: O3

void __thiscall
HighsSeparator::run(HighsSeparator *this,HighsLpRelaxation *lpRelaxation,
                   HighsLpAggregator *lpAggregator,HighsTransformedLp *transLp,HighsCutPool *cutpool
                   )

{
  pointer ppVar1;
  pointer piVar2;
  pointer ppVar3;
  pointer piVar4;
  
  this->numCalls = this->numCalls + 1;
  ppVar1 = (cutpool->matrix_).ARrange_.
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar2 = (cutpool->matrix_).deletedrows_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  ppVar3 = (cutpool->matrix_).ARrange_.
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (cutpool->matrix_).deletedrows_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  HighsTimer::start(&lpRelaxation->mipsolver->timer_,this->clockIndex);
  (**this->_vptr_HighsSeparator)(this,lpRelaxation,lpAggregator,transLp,cutpool);
  HighsTimer::stop(&lpRelaxation->mipsolver->timer_,this->clockIndex);
  this->numCutsFound =
       (((int)((ulong)((long)piVar2 - (long)piVar4) >> 2) -
        (int)((ulong)((long)ppVar1 - (long)ppVar3) >> 3)) + this->numCutsFound +
       (int)((ulong)((long)(cutpool->matrix_).ARrange_.
                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(cutpool->matrix_).ARrange_.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3)) -
       (int)((ulong)((long)(cutpool->matrix_).deletedrows_.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(cutpool->matrix_).deletedrows_.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2);
  return;
}

Assistant:

void HighsSeparator::run(HighsLpRelaxation& lpRelaxation,
                         HighsLpAggregator& lpAggregator,
                         HighsTransformedLp& transLp, HighsCutPool& cutpool) {
  ++numCalls;
  HighsInt currNumCuts = cutpool.getNumCuts();

  lpRelaxation.getMipSolver().timer_.start(clockIndex);
  separateLpSolution(lpRelaxation, lpAggregator, transLp, cutpool);
  lpRelaxation.getMipSolver().timer_.stop(clockIndex);

  numCutsFound += cutpool.getNumCuts() - currNumCuts;
}